

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantInnerTriangleSetCase::compare
          (InvariantInnerTriangleSetCase *this,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB,
          int param_3)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  float fVar4;
  TessPrimitiveType TVar5;
  pointer pVVar6;
  pointer pVVar7;
  pointer pVVar8;
  TestLog *pTVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  undefined1 *puVar17;
  long *plVar18;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *pvVar19;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  long lVar20;
  _Link_type p_Var21;
  _Link_type p_Var22;
  _Link_type p_Var23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  TestLog *local_260;
  ulong local_258;
  ulong local_250;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  _Link_type local_220;
  float local_218;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_210;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [16];
  _Base_ptr local_198;
  float local_190;
  undefined1 local_18c [84];
  ios_base local_138 [264];
  
  TVar5 = (this->super_PrimitiveSetInvarianceCase).m_primitiveType;
  uVar11 = 0;
  if (TVar5 == TESSPRIMITIVETYPE_QUADS) {
    pTVar9 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_250 = (long)(coordsA->
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(coordsA->
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_258 = (long)(coordsB->
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(coordsB->
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_t._M_impl._0_1_ = 0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210._M_t._M_impl._0_1_ = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var23 = (_Link_type)coordsA;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar25 = local_258;
      if (uVar11 == 0) {
        uVar25 = local_250;
      }
      local_248 = &local_210;
      if (uVar11 == 0) {
        local_248 = &local_1e0;
      }
      uVar12 = (int)(uVar25 >> 2) * -0x55555555;
      if (2 < (int)uVar12) {
        uVar25 = 0;
LAB_0144deae:
        lVar13 = uVar25 * 0x300000000;
        pvVar19 = coordsB;
        if (uVar11 == 0) {
          pvVar19 = coordsA;
        }
        pVVar6 = (pvVar19->
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = lVar13 + 0x100000000 >> 0x20;
        local_218 = pVVar6[lVar20].m_data[2];
        p_Var21 = (_Link_type)(ulong)(uint)local_218;
        local_220 = *(_Link_type *)pVVar6[lVar20].m_data;
        lVar20 = lVar13 + 0x200000000 >> 0x20;
        local_1b0 = *(undefined1 (*) [8])pVVar6[lVar13 >> 0x20].m_data;
        local_1a8._0_4_ = pVVar6[lVar13 >> 0x20].m_data[2];
        local_1a8._12_4_ = local_218;
        local_1a8._4_8_ = local_220;
        local_190 = pVVar6[lVar20].m_data[2];
        local_198 = *(_Base_ptr *)pVVar6[lVar20].m_data;
        p_Var23 = local_220;
        if ((((float)local_1b0._0_4_ != 0.0) || (NAN((float)local_1b0._0_4_))) &&
           (((float)local_1b0._0_4_ != 1.0 || (NAN((float)local_1b0._0_4_))))) {
          bVar27 = false;
          uVar24 = 0;
          do {
            p_Var21 = (_Link_type)CONCAT71((int7)((ulong)p_Var21 >> 8),1);
            do {
              p_Var22 = p_Var21;
              p_Var21 = p_Var22;
              if ((char)p_Var22 == '\0') goto LAB_0144df98;
              fVar4 = *(float *)(local_1b0 + uVar24 * 0xc + 4);
              p_Var23 = p_Var22;
              if ((fVar4 == 0.0) && (!NAN(fVar4))) break;
              p_Var21 = (_Link_type)0x0;
            } while ((fVar4 != 1.0) || (NAN(fVar4)));
            if ((char)p_Var22 != '\0') goto LAB_0144dfc4;
LAB_0144df98:
            uVar1 = uVar24 + 1;
            bVar27 = 1 < uVar24;
            if (uVar1 == 3) goto LAB_0144dfc4;
            fVar4 = *(float *)(local_1b0 + uVar1 * 0xc);
            if (((fVar4 == 0.0) && (!NAN(fVar4))) ||
               ((uVar24 = uVar1, fVar4 == 1.0 && (!NAN(fVar4))))) goto LAB_0144dfc4;
          } while( true );
        }
        goto LAB_0144e019;
      }
LAB_0144e025:
      bVar27 = uVar11 == 0;
      uVar11 = uVar11 + 1;
    } while (bVar27);
    p_Var2 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &local_210._M_t._M_impl.super__Rb_tree_header;
    uVar11 = (uint)((_Rb_tree_header *)
                    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var3 &&
                   (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                   == p_Var2);
    if ((_Rb_tree_header *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3
        || (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           p_Var2) {
      bVar28 = (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var2;
      bVar27 = (_Rb_tree_header *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var3;
      p_Var15 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (!bVar28 && !bVar27) {
        while( true ) {
          p_Var23 = (_Link_type)(p_Var16 + 1);
          bVar10 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                             ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1),
                              (Vector<tcu::Vector<float,_3>,_3> *)p_Var23);
          if (!bVar10) break;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          p_Var3 = &local_210._M_t._M_impl.super__Rb_tree_header;
          bVar27 = (_Rb_tree_header *)p_Var16 == p_Var3 && (_Rb_tree_header *)p_Var15 == p_Var2;
          uVar11 = (uint)bVar27;
          if (bVar27) goto LAB_0144e6a7;
          bVar27 = (_Rb_tree_header *)p_Var16 == p_Var3;
          bVar28 = (_Rb_tree_header *)p_Var15 == p_Var2;
          if ((bVar28) || ((_Rb_tree_header *)p_Var16 == p_Var3)) break;
        }
      }
      local_1b0 = (undefined1  [8])pTVar9;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                 ,0x5a);
      local_240 = &local_230;
      local_238 = 0;
      local_230 = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_2a0 = &local_290;
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_290 = *plVar18;
        lStack_288 = plVar14[3];
      }
      else {
        local_290 = *plVar18;
        local_2a0 = (long *)*plVar14;
      }
      local_298 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_270 = *plVar18;
        lStack_268 = plVar14[3];
        local_280 = &local_270;
      }
      else {
        local_270 = *plVar18;
        local_280 = (long *)*plVar14;
      }
      local_278 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_280,local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_280 != &local_270) {
        operator_delete(local_280,local_270 + 1);
      }
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((bVar28) ||
         ((!bVar27 &&
          (bVar27 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                    ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                  *)(p_Var15 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1),
                                 b_00), !bVar27)))) {
        local_1b0 = (undefined1  [8])pTVar9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)local_1a8,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," exists for second case but not for first",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0 = (undefined1  [8])pTVar9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)local_1a8,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," exists for first case but not for second",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      p_Var23 = (_Link_type)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
LAB_0144e6a7:
    std::
    _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var23);
    std::
    _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var23);
  }
  else if (TVar5 == TESSPRIMITIVETYPE_TRIANGLES) {
    local_258 = (long)(coordsA->
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(coordsA->
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    pVVar6 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar7 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_260 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_t._M_impl._0_1_ = 0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210._M_t._M_impl._0_1_ = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var23 = (_Link_type)coordsA;
    iVar26 = 0;
    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar25 = (long)pVVar6 - (long)pVVar7;
      if (iVar26 == 0) {
        uVar25 = local_258;
      }
      local_248 = &local_210;
      if (iVar26 == 0) {
        local_248 = &local_1e0;
      }
      uVar11 = (int)(uVar25 >> 2) * -0x55555555;
      if (2 < (int)uVar11) {
        uVar25 = (ulong)uVar11 / 3;
        uVar24 = 0;
        local_250 = uVar25;
        do {
          puVar17 = local_1b0 + 4;
          lVar13 = uVar24 * 0x300000000;
          pvVar19 = coordsB;
          if (iVar26 == 0) {
            pvVar19 = coordsA;
          }
          pVVar8 = (pvVar19->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar20 = lVar13 + 0x100000000 >> 0x20;
          local_218 = pVVar8[lVar20].m_data[2];
          local_220 = *(_Link_type *)pVVar8[lVar20].m_data;
          lVar20 = lVar13 + 0x200000000 >> 0x20;
          local_1b0 = *(undefined1 (*) [8])pVVar8[lVar13 >> 0x20].m_data;
          local_1a8._0_4_ = pVVar8[lVar13 >> 0x20].m_data[2];
          local_1a8._12_4_ = local_218;
          local_1a8._4_8_ = local_220;
          local_190 = pVVar8[lVar20].m_data[2];
          local_198 = *(_Base_ptr *)pVVar8[lVar20].m_data;
          if (((float)local_1b0._0_4_ != 0.0) || (p_Var23 = local_220, NAN((float)local_1b0._0_4_)))
          {
            bVar27 = false;
            p_Var21 = (_Link_type)0x0;
            do {
              p_Var22 = (_Link_type)0x0;
              do {
                p_Var23 = p_Var22;
                if (p_Var23 == (_Link_type)0x2) goto LAB_0144dc56;
                p_Var22 = (_Link_type)((long)&(p_Var23->super__Rb_tree_node_base)._M_color + 1);
              } while ((*(float *)(puVar17 + (long)p_Var23 * 4) != 0.0) ||
                      (NAN(*(float *)(puVar17 + (long)p_Var23 * 4))));
              if (p_Var23 < (_Link_type)0x2) break;
LAB_0144dc56:
              p_Var23 = (_Link_type)((long)&(p_Var21->super__Rb_tree_node_base)._M_color + 1);
              bVar27 = (_Link_type)&DAT_00000001 < p_Var21;
              if (p_Var23 == (_Link_type)0x3) break;
              puVar17 = puVar17 + 0xc;
              p_Var21 = p_Var23;
            } while ((*(float *)(local_1b0 + (long)p_Var23 * 0xc) != 0.0) ||
                    (NAN(*(float *)(local_1b0 + (long)p_Var23 * 0xc))));
            if (bVar27) {
              std::
              __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>>
                        (local_1b0,local_18c);
              p_Var23 = (_Link_type)local_1b0;
              std::
              set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              ::insert(local_248,(value_type *)p_Var23);
              uVar25 = local_250;
            }
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar25);
      }
      bVar27 = iVar26 == 0;
      iVar26 = iVar26 + 1;
    } while (bVar27);
    p_Var2 = &local_1e0._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &local_210._M_t._M_impl.super__Rb_tree_header;
    uVar11 = (uint)((_Rb_tree_header *)
                    local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var3 &&
                   (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                   == p_Var2);
    if ((_Rb_tree_header *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3
        || (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           p_Var2) {
      bVar28 = (_Rb_tree_header *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var2;
      bVar27 = (_Rb_tree_header *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var3;
      p_Var15 = local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (!bVar28 && !bVar27) {
        while( true ) {
          p_Var23 = (_Link_type)(p_Var16 + 1);
          bVar10 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                             ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1),
                              (Vector<tcu::Vector<float,_3>,_3> *)p_Var23);
          if (!bVar10) break;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          p_Var3 = &local_210._M_t._M_impl.super__Rb_tree_header;
          bVar27 = (_Rb_tree_header *)p_Var16 == p_Var3 && (_Rb_tree_header *)p_Var15 == p_Var2;
          uVar11 = (uint)bVar27;
          if (bVar27) goto LAB_0144e43f;
          bVar27 = (_Rb_tree_header *)p_Var16 == p_Var3;
          bVar28 = (_Rb_tree_header *)p_Var15 == p_Var2;
          if ((bVar28) || ((_Rb_tree_header *)p_Var16 == p_Var3)) break;
        }
      }
      local_1b0 = (undefined1  [8])local_260;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                 ,0x5a);
      local_240 = &local_230;
      local_238 = 0;
      local_230 = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_2a0 = &local_290;
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_290 = *plVar18;
        lStack_288 = plVar14[3];
      }
      else {
        local_290 = *plVar18;
        local_2a0 = (long *)*plVar14;
      }
      local_298 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_270 = *plVar18;
        lStack_268 = plVar14[3];
        local_280 = &local_270;
      }
      else {
        local_270 = *plVar18;
        local_280 = (long *)*plVar14;
      }
      local_278 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_280,local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_280 != &local_270) {
        operator_delete(local_280,local_270 + 1);
      }
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((bVar28) ||
         ((!bVar27 &&
          (bVar27 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                    ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                  *)(p_Var15 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1),
                                 b), !bVar27)))) {
        local_1b0 = (undefined1  [8])local_260;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)local_1a8,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," exists for second case but not for first",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0 = (undefined1  [8])local_260;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)local_1a8,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," exists for first case but not for second",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      p_Var23 = (_Link_type)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
LAB_0144e43f:
    std::
    _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                *)local_210._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var23);
    std::
    _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                *)local_1e0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var23);
  }
  return SUB41(uVar11,0);
LAB_0144dfc4:
  if (bVar27) {
    std::
    __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>>
              (local_1b0,local_18c);
    p_Var23 = (_Link_type)local_1b0;
    std::
    set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
    ::insert(local_248,(value_type *)p_Var23);
  }
LAB_0144e019:
  uVar25 = uVar25 + 1;
  if (uVar25 == (ulong)uVar12 / 3) goto LAB_0144e025;
  goto LAB_0144deae;
}

Assistant:

virtual bool compare (const vector<Vec3>& coordsA, const vector<Vec3>& coordsB, int) const
	{
		if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}